

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

bool __thiscall libtorrent::aux::torrent::want_peers(torrent *this)

{
  ulong uVar1;
  peer_list *ppVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint uVar5;
  unique_lock<std::mutex> local_28;
  
  uVar1 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
  if ((uVar1 & 0x9c000000) != 0) {
    return false;
  }
  uVar5 = (uint)(uVar1 >> 0x20);
  if ((int)((ulong)((long)(this->super_torrent_hot_members).m_connections.
                          super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          .
                          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->super_torrent_hot_members).m_connections.
                         super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                         .
                         super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) -
      (int)((ulong)((long)(this->m_peers_to_disconnect).
                          super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_peers_to_disconnect).
                         super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) <
      (int)(uVar5 >> 1 & 0xffffff)) {
    uVar5 = uVar5 >> 0x19 & 7;
    if ((((uVar5 != 7) && (uVar5 != 1)) ||
        ((((this->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_files
         ).m_piece_length < 1)) &&
       ((ppVar2 = (this->super_torrent_hot_members).m_peer_list._M_t.
                  super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                  .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl,
        ppVar2 != (peer_list *)0x0 && (ppVar2->m_num_connect_candidates != 0)))) {
      iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x2e])();
      local_28._M_device = (mutex_type *)(CONCAT44(extraout_var,iVar4) + 0x438);
      local_28._M_owns = false;
      ::std::unique_lock<std::mutex>::lock(&local_28);
      local_28._M_owns = true;
      uVar1 = *(ulong *)(CONCAT44(extraout_var,iVar4) + 0x428);
      ::std::unique_lock<std::mutex>::~unique_lock(&local_28);
      if (((uVar1 >> 0x2a & 1) != 0) ||
         ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xc00000000000000) !=
          0x800000000000000)) {
        iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[0x2e])();
        bVar3 = session_settings::get_bool
                          ((session_settings *)CONCAT44(extraout_var_00,iVar4),0x8022);
        if (!bVar3) {
          iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                    _vptr_session_logger[0x2e])();
          bVar3 = session_settings::get_bool
                            ((session_settings *)CONCAT44(extraout_var_01,iVar4),0x8020);
          if (!bVar3) {
            return false;
          }
        }
        return true;
      }
    }
    return false;
  }
  return false;
}

Assistant:

bool torrent::want_peers() const
	{
		// if all our connection slots are taken, we can't connect to more
		if (num_peers() >= int(m_max_connections)) return false;

		// if we're paused, obviously we're not connecting to peers
		if (is_paused() || m_abort || m_graceful_pause_mode) return false;

		if ((m_state == torrent_status::checking_files
			|| m_state == torrent_status::checking_resume_data)
			&& valid_metadata())
			return false;

		// if we don't know of any more potential peers to connect to, there's
		// no point in trying
		if (!m_peer_list || m_peer_list->num_connect_candidates() == 0)
			return false;

		// if the user disabled outgoing connections for seeding torrents,
		// don't make any
		if (!settings().get_bool(settings_pack::seeding_outgoing_connections)
			&& (m_state == torrent_status::seeding
				|| m_state == torrent_status::finished))
			return false;

		if (!settings().get_bool(settings_pack::enable_outgoing_tcp)
			&& !settings().get_bool(settings_pack::enable_outgoing_utp))
			return false;

		return true;
	}